

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

bool CheckShader(GLuint handle,char *desc)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  int iVar2;
  GLchar *ptr;
  uint uVar3;
  size_t size;
  GLint log_length;
  ImVector<char> buf;
  GLint status;
  GLint local_4c;
  undefined8 local_48;
  GLchar *pGStack_40;
  GLint local_34;
  
  local_34 = 0;
  local_4c = 0;
  (*gl3wGetShaderiv)(handle,0x8b81,&local_34);
  uVar1 = (*gl3wGetShaderiv)(handle,0x8b84,&local_4c);
  if ((char)local_34 == '\0') {
    iVar2 = fprintf(_stderr,"ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n",
                    desc);
    uVar1 = (undefined1)iVar2;
  }
  if (1 < local_4c) {
    local_48 = 0;
    pGStack_40 = (GLchar *)0x0;
    uVar3 = local_4c + 1;
    size = 8;
    if (8 < uVar3) {
      size = (size_t)uVar3;
    }
    ptr = (GLchar *)ImGui::MemAlloc(size);
    local_48 = CONCAT44((int)size,uVar3);
    pGStack_40 = ptr;
    (*gl3wGetShaderInfoLog)(handle,local_4c,(GLsizei *)0x0,ptr);
    iVar2 = fprintf(_stderr,"%s\n",ptr);
    uVar1 = (undefined1)iVar2;
    if (ptr != (GLchar *)0x0) {
      ImGui::MemFree(ptr);
      uVar1 = extraout_AL;
    }
  }
  return (bool)uVar1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n", desc);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}